

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O1

region * __thiscall
toml::detail::literal::scan(region *__return_storage_ptr__,literal *this,location *loc)

{
  size_t sVar1;
  element_type *peVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  location first;
  location local_68;
  
  location::location(&local_68,loc);
  sVar1 = this->size_;
  if (sVar1 != 0) {
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    sVar10 = loc->location_;
    lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar3;
    pcVar4 = this->value_;
    sVar9 = loc->column_number_;
    sVar7 = loc->line_number_;
    sVar8 = 0;
    do {
      if ((uVar6 <= sVar10) || (pcVar4[sVar8] != *(char *)(lVar3 + sVar10))) {
        (loc->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_68.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &local_68.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&loc->source_name_,&local_68.source_name_);
        loc->column_number_ = local_68.column_number_;
        loc->location_ = local_68.location_;
        loc->line_number_ = local_68.line_number_;
        region::region(__return_storage_ptr__);
        goto LAB_003bd858;
      }
      if (sVar10 + 1 < uVar6) {
        if (*(char *)(lVar3 + sVar10) == '\n') {
          sVar7 = sVar7 + 1;
          loc->line_number_ = sVar7;
          sVar9 = 1;
        }
        else {
          sVar9 = sVar9 + 1;
        }
        loc->column_number_ = sVar9;
        uVar5 = sVar10 + 1;
      }
      else {
        for (; uVar5 = uVar6, uVar6 != sVar10; sVar10 = sVar10 + 1) {
          if (*(char *)(lVar3 + sVar10) == '\n') {
            sVar7 = sVar7 + 1;
            loc->line_number_ = sVar7;
            sVar9 = 1;
          }
          else {
            sVar9 = sVar9 + 1;
          }
          loc->column_number_ = sVar9;
        }
      }
      sVar10 = uVar5;
      loc->location_ = sVar10;
      sVar8 = sVar8 + 1;
    } while (sVar8 != sVar1);
  }
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_68.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_68.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_68.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_68.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->source_name_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->source_name_,local_68.source_name_._M_dataplus._M_p,
             local_68.source_name_._M_dataplus._M_p + local_68.source_name_._M_string_length);
  __return_storage_ptr__->first_ = local_68.location_;
  __return_storage_ptr__->first_line_ = local_68.line_number_;
  __return_storage_ptr__->first_column_ = local_68.column_number_;
  sVar1 = loc->location_;
  sVar10 = loc->line_number_;
  __return_storage_ptr__->length_ = sVar1 - local_68.location_;
  __return_storage_ptr__->last_ = sVar1;
  __return_storage_ptr__->last_line_ = sVar10;
  __return_storage_ptr__->last_column_ = loc->column_number_;
LAB_003bd858:
  location::~location(&local_68);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region literal::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<size_; ++i)
    {
        if(loc.eof() || char_type(value_[i]) != loc.current())
        {
            loc = first;
            return region{};
        }
        loc.advance(1);
    }
    return region(first, loc);
}